

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>::operator=
          (ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *this,
          ExceptionOr<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::Promise<kj::AsyncCapabilityStream::ReadResult>_>::operator=
            (&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;